

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cc
# Opt level: O3

btree_result btree_find(btree *btree,void *key,void *value_buf)

{
  ulong uVar1;
  _func_voidref_void_ptr_bid_t *p_Var2;
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *p_Var3;
  _func_bid_t_void_ptr *p_Var4;
  void *pvVar5;
  code *pcVar6;
  _func_void_void_ptr *p_Var7;
  void *pvVar8;
  ushort uVar9;
  idx_t iVar10;
  uint uVar11;
  int iVar12;
  bnode *node_00;
  bnode *pbVar13;
  bid_t bVar14;
  btree_print_func *pbVar15;
  void *pvVar16;
  btree_result bVar17;
  bnode *node;
  ulong uVar18;
  void *pvVar19;
  ulong uStack_58;
  bid_t bStack_50;
  void *local_48;
  void *local_40;
  void *local_38;
  
  local_48 = value_buf;
  local_38 = key;
  pvVar16 = (void *)((long)&local_48 - (ulong)(btree->ksize + 0xf & 0xfffffff0));
  pvVar19 = (void *)((long)pvVar16 - (ulong)(btree->vsize + 0xf & 0xfffffff0));
  uVar9 = btree->height;
  uVar11 = (uint)uVar9 * 8 + 0xf & 0xfffffff0;
  pbVar15 = btree->kv_ops->init_kv_var;
  local_40 = pvVar16;
  if (pbVar15 != (btree_print_func *)0x0) {
    *(undefined8 *)((long)pvVar19 + (-8 - (ulong)uVar11)) = 0x109ec0;
    (*pbVar15)(btree,pvVar16,pvVar19);
    uVar9 = btree->height;
  }
  *(bid_t *)((long)pvVar19 + (ulong)uVar9 * 8 + (-8 - (ulong)uVar11)) = btree->root_bid;
  uVar18 = (ulong)uVar9;
  if (uVar9 != 0) {
    do {
      pvVar16 = btree->blk_handle;
      bVar14 = *(bid_t *)((long)pvVar19 + uVar18 * 8 + (-8 - (ulong)uVar11));
      p_Var2 = btree->blk_ops->blk_read;
      *(undefined8 *)((long)pvVar19 + (-8 - (ulong)uVar11)) = 0x109eef;
      node_00 = (bnode *)(*p_Var2)(pvVar16,bVar14);
      pvVar16 = local_38;
      pbVar13 = node_00 + 1;
      if ((node_00->flag & 2) != 0) {
        pbVar13 = (bnode *)((long)&pbVar13->kvsize +
                           (ulong)((ushort)(pbVar13->kvsize << 8 | pbVar13->kvsize >> 8) + 0x11 &
                                  0xfffffff0));
      }
      (node_00->field_4).data = pbVar13;
      *(undefined8 *)((long)pvVar19 + (-8 - (ulong)uVar11)) = 0x109f25;
      iVar10 = _btree_find_entry(btree,node_00,pvVar16);
      pvVar16 = local_40;
      if (iVar10 == 0xffff) {
LAB_00109f7e:
        p_Var7 = btree->blk_ops->blk_operation_end;
        if (p_Var7 != (_func_void_void_ptr *)0x0) {
          pvVar16 = btree->blk_handle;
          *(undefined8 *)((long)pvVar19 + (-8 - (ulong)uVar11)) = 0x109f91;
          (*p_Var7)(pvVar16);
        }
        pbVar15 = btree->kv_ops->free_kv_var;
        bVar17 = BTREE_RESULT_FAIL;
        goto LAB_00109fd0;
      }
      p_Var3 = btree->kv_ops->get_kv;
      *(undefined8 *)((long)pvVar19 + (-8 - (ulong)uVar11)) = 0x109f42;
      (*p_Var3)(node_00,iVar10,pvVar16,pvVar19);
      pvVar8 = local_38;
      if (uVar18 == 1) {
        pvVar5 = btree->aux;
        pcVar6 = (code *)btree->kv_ops->cmp;
        *(undefined8 *)((long)pvVar19 + (-8 - (ulong)uVar11)) = 0x109f7a;
        iVar12 = (*pcVar6)(pvVar8,pvVar16,pvVar5);
        pvVar16 = local_48;
        if (iVar12 != 0) goto LAB_00109f7e;
        pbVar15 = btree->kv_ops->set_value;
        *(undefined8 *)((long)pvVar19 + (-8 - (ulong)uVar11)) = 0x109fb2;
        (*pbVar15)(btree,pvVar16,pvVar19);
        break;
      }
      uVar1 = uVar18 - 1;
      p_Var4 = btree->kv_ops->value2bid;
      *(undefined8 *)((long)pvVar19 + (-8 - (ulong)uVar11)) = 0x109f56;
      bVar14 = (*p_Var4)(pvVar19);
      *(bid_t *)((long)pvVar19 + uVar18 * 8 + (-0x10 - (ulong)uVar11)) =
           bVar14 >> 0x38 | (bVar14 & 0xff000000000000) >> 0x28 | (bVar14 & 0xff0000000000) >> 0x18
           | (bVar14 & 0xff00000000) >> 8 | (bVar14 & 0xff000000) << 8 | (bVar14 & 0xff0000) << 0x18
           | (bVar14 & 0xff00) << 0x28 | bVar14 << 0x38;
      uVar18 = uVar1;
    } while (uVar1 != 0);
  }
  p_Var7 = btree->blk_ops->blk_operation_end;
  if (p_Var7 != (_func_void_void_ptr *)0x0) {
    pvVar16 = btree->blk_handle;
    *(undefined8 *)((long)pvVar19 + (-8 - (ulong)uVar11)) = 0x109fc5;
    (*p_Var7)(pvVar16);
  }
  pbVar15 = btree->kv_ops->free_kv_var;
  bVar17 = BTREE_RESULT_SUCCESS;
LAB_00109fd0:
  pvVar16 = local_40;
  if (pbVar15 != (btree_print_func *)0x0) {
    *(undefined8 *)((long)pvVar19 + (-8 - (ulong)uVar11)) = 0x109fe1;
    (*pbVar15)(btree,pvVar16,pvVar19);
  }
  return bVar17;
}

Assistant:

btree_result btree_find(struct btree *btree, void *key, void *value_buf)
{
    void *addr;
    uint8_t *k = alca(uint8_t, btree->ksize);
    uint8_t *v = alca(uint8_t, btree->vsize);
    idx_t *idx = alca(idx_t, btree->height);
    bid_t *bid = alca(bid_t, btree->height);
    struct bnode **node = alca(struct bnode *, btree->height);
    int i;

    if (btree->kv_ops->init_kv_var) btree->kv_ops->init_kv_var(btree, k, v);

    // set root
    bid[btree->height-1] = btree->root_bid;

    for (i=btree->height-1; i>=0; --i) {
        // read block using bid
        addr = btree->blk_ops->blk_read(btree->blk_handle, bid[i]);
        // fetch node structure from block
        node[i] = _fetch_bnode(btree, addr, i+1);

        // lookup key in current node
        idx[i] = _btree_find_entry(btree, node[i], key);

        if (idx[i] == BTREE_IDX_NOT_FOUND) {
            // not found .. return NULL
            if (btree->blk_ops->blk_operation_end)
                btree->blk_ops->blk_operation_end(btree->blk_handle);
            if (btree->kv_ops->free_kv_var) btree->kv_ops->free_kv_var(btree, k, v);
            return BTREE_RESULT_FAIL;
        }

        btree->kv_ops->get_kv(node[i], idx[i], k, v);

        if (i>0) {
            // index (non-leaf) node
            // get bid of child node from value
            bid[i-1] = btree->kv_ops->value2bid(v);
            bid[i-1] = _endian_decode(bid[i-1]);
        }else{
            // leaf node
            // return (address of) value if KEY == k
            if (!btree->kv_ops->cmp(key, k, btree->aux)) {
                btree->kv_ops->set_value(btree, value_buf, v);
            }else{
                if (btree->blk_ops->blk_operation_end)
                    btree->blk_ops->blk_operation_end(btree->blk_handle);
                if (btree->kv_ops->free_kv_var) {
                    btree->kv_ops->free_kv_var(btree, k, v);
                }
                return BTREE_RESULT_FAIL;
            }
        }
    }
    if (btree->blk_ops->blk_operation_end) {
        btree->blk_ops->blk_operation_end(btree->blk_handle);
    }
    if (btree->kv_ops->free_kv_var) btree->kv_ops->free_kv_var(btree, k, v);
    return BTREE_RESULT_SUCCESS;
}